

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

boolean block_entry(xchar x,xchar y)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  monst *mtmp;
  obj *poVar6;
  char *pcVar7;
  
  if ((level->locations[u.ux][u.uy].typ == '\x17') &&
     ((*(uint *)&level->locations[u.ux][u.uy].field_0x6 & 0x1f0) == 0x10)) {
    pcVar5 = in_rooms(level,x,y,0x12);
    cVar1 = *pcVar5;
    if ((((-1 < (long)cVar1) &&
         (((('\x11' < level->rooms[cVar1].rtype &&
            (mtmp = shop_keeper(level,cVar1), mtmp != (monst *)0x0)) &&
           (iVar4 = inhishop(mtmp), iVar4 != 0)) &&
          (((char)mtmp[0x1b].mintrinsics == u.ux &&
           (*(char *)((long)&mtmp[0x1b].mintrinsics + 1) == u.uy)))))) &&
        (cVar1 = (char)mtmp[0x1b].movement, mtmp->mx == cVar1)) &&
       (((cVar2 = *(char *)((long)&mtmp[0x1b].movement + 1), mtmp->my == cVar2 &&
         ((*(uint *)&mtmp->field_0x60 & 0xc0000) == 0x40000)) &&
        ((cVar1 + 1 == (int)x || cVar1 + -1 == (int)x ||
         (cVar2 + 1 == (int)y || cVar2 + -1 == (int)y)))))) {
      if (((youmonst.data == mons + 0x7b || youmonst.data == mons + 0x9e) ||
           (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0)) &&
         (u.uprops[0xd].blocked == 0)) {
LAB_0024318e:
        pcVar5 = " senses your motion and";
        if (u.uprops[0xd].blocked != 0) {
          pcVar5 = "";
        }
        pcVar7 = "";
        if (youmonst.data == mons + 0x7b) {
          pcVar7 = pcVar5;
        }
        if (youmonst.data == mons + 0x9e) {
          pcVar7 = pcVar5;
        }
        if (u.uprops[0xd].extrinsic != 0 || u.uprops[0xd].intrinsic != 0) {
          pcVar7 = pcVar5;
        }
        pline("%s%s blocks your way!",(undefined1 *)((long)&mtmp[0x1c].minvent + 5),pcVar7);
        return '\x01';
      }
      bVar3 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
      if (bVar3 == '\0') {
        poVar6 = carrying(0x108);
        if ((poVar6 != (obj *)0x0) ||
           (poVar6 = carrying(0x33), poVar6 != (obj *)0x0 || u.usteed != (monst *)0x0))
        goto LAB_0024318e;
      }
      else if (u.usteed != (monst *)0x0) goto LAB_0024318e;
    }
  }
  return '\0';
}

Assistant:

boolean block_entry(xchar x, xchar y)
{
	xchar sx, sy;
	int roomno;
	struct monst *shkp;

	if (!(IS_DOOR(level->locations[u.ux][u.uy].typ) &&
		level->locations[u.ux][u.uy].doormask == D_BROKEN)) return FALSE;

	roomno = *in_rooms(level, x, y, SHOPBASE);
	if (roomno < 0 || !IS_SHOP(level, roomno)) return FALSE;
	if (!(shkp = shop_keeper(level, (char)roomno)) || !inhishop(shkp))
		return FALSE;

	if (ESHK(shkp)->shd.x != u.ux || ESHK(shkp)->shd.y != u.uy)
		return FALSE;

	sx = ESHK(shkp)->shk.x;
	sy = ESHK(shkp)->shk.y;

	if (shkp->mx == sx && shkp->my == sy
		&& shkp->mcanmove && !shkp->msleeping
		&& (x == sx-1 || x == sx+1 || y == sy-1 || y == sy+1)
		&& (Invis ||
		    (!Is_blackmarket(&u.uz) &&
		     (carrying(PICK_AXE) || carrying(DWARVISH_MATTOCK))) ||
		    u.usteed)) {
		pline("%s%s blocks your way!", shkname(shkp),
				Invis ? " senses your motion and" : "");
		return TRUE;
	}
	return FALSE;
}